

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

int dedotdotify(char *input,size_t clen,char **outp)

{
  byte *pbVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  
  *outp = (char *)0x0;
  pvVar6 = memchr(input,0x2e,clen);
  if (pvVar6 != (void *)0x0) {
    pcVar7 = (char *)(*Curl_cmalloc)(clen + 1);
    if (pcVar7 == (char *)0x0) {
      return 1;
    }
    pcVar10 = input + clen;
    *pcVar7 = '\0';
    pcVar9 = pcVar7;
    do {
      if (*input == '/') {
        iVar5 = strncmp("/./",input,3);
        if (iVar5 == 0) {
LAB_00166e6f:
          input = input + 2;
          goto LAB_00166e90;
        }
        iVar5 = strcmp("/.",input);
        if ((iVar5 != 0) && (iVar5 = strncmp("/.?",input,3), iVar5 != 0)) {
          iVar5 = strncmp("/../",input,4);
          if (iVar5 == 0) {
            input = input + 3;
            pcVar8 = pcVar9;
            do {
              pcVar9 = pcVar8;
              if (pcVar8 <= pcVar7) break;
              pcVar9 = pcVar8 + -1;
              pcVar2 = pcVar8 + -1;
              pcVar8 = pcVar9;
            } while (*pcVar2 != '/');
            *pcVar9 = '\0';
            bVar3 = true;
            goto LAB_00166e93;
          }
          iVar5 = strcmp("/..",input);
          pcVar8 = pcVar9;
          if ((iVar5 != 0) && (iVar5 = strncmp("/..?",input,4), iVar5 != 0)) goto LAB_00166e54;
          do {
            pcVar9 = pcVar8;
            if (pcVar8 <= pcVar7) break;
            pcVar9 = pcVar8 + -1;
            pcVar2 = pcVar8 + -1;
            pcVar8 = pcVar9;
          } while (*pcVar2 != '/');
        }
        *pcVar9 = '/';
        pcVar9 = pcVar9 + 1;
        bVar4 = false;
        pcVar8 = pcVar9;
LAB_00166ebd:
        *pcVar8 = '\0';
      }
      else {
        if (*input == '.') {
          iVar5 = strncmp("./",input,2);
          if (iVar5 == 0) goto LAB_00166e6f;
          iVar5 = strncmp("../",input,3);
          if (iVar5 != 0) {
            iVar5 = strcmp(".",input);
            pcVar8 = pcVar7;
            if (((iVar5 == 0) || (iVar5 = strcmp("..",input), iVar5 == 0)) ||
               (iVar5 = strncmp(".?",input,2), iVar5 == 0)) {
              bVar4 = false;
            }
            else {
              iVar5 = strncmp("..?",input,3);
              bVar3 = false;
              bVar4 = false;
              if (iVar5 != 0) goto LAB_00166e93;
            }
            goto LAB_00166ebd;
          }
          input = input + 3;
LAB_00166e90:
          bVar3 = true;
        }
        else {
LAB_00166e54:
          bVar3 = false;
        }
LAB_00166e93:
        bVar4 = true;
        if (!bVar3) {
          do {
            do {
              *pcVar9 = *input;
              pbVar1 = (byte *)(input + 1);
              input = input + 1;
              pcVar9 = pcVar9 + 1;
            } while (0x3f < (ulong)*pbVar1);
          } while ((0x8000800000000001U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0);
          bVar4 = true;
          pcVar8 = pcVar9;
          goto LAB_00166ebd;
        }
      }
    } while ((bVar4) && (input < pcVar10));
    *outp = pcVar7;
  }
  return 0;
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  char *outptr;
  const char *endp = &input[clen];
  char *out;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if((clen < 2) || !memchr(input, '.', clen))
    return 0;

  out = malloc(clen + 1);
  if(!out)
    return 1; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A. If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D. if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C. if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E. move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of path */
  } while(input < endp);

  *outp = out;
  return 0; /* success */
}